

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O0

Matrix44<double> * __thiscall
Imath_2_5::Matrix44<double>::rotate<double>(Matrix44<double> *this,Vec3<double> *r)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  Vec3<double> *in_RSI;
  Matrix44<double> *in_RDI;
  double dVar4;
  Matrix44<double> P;
  double m22;
  double m21;
  double m20;
  double m12;
  double m11;
  double m10;
  double m02;
  double m01;
  double m00;
  double sin_rx;
  double cos_rx;
  double sin_ry;
  double cos_ry;
  double sin_rz;
  double cos_rz;
  Matrix44<double> local_108;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  double local_20;
  double local_18;
  Vec3<double> *local_10;
  
  local_10 = in_RSI;
  pdVar3 = Vec3<double>::operator[](in_RSI,2);
  local_18 = Math<double>::cos(*pdVar3);
  pdVar3 = Vec3<double>::operator[](local_10,1);
  local_28 = Math<double>::cos(*pdVar3);
  pdVar3 = Vec3<double>::operator[](local_10,0);
  local_38 = Math<double>::cos(*pdVar3);
  pdVar3 = Vec3<double>::operator[](local_10,2);
  local_20 = Math<double>::sin(*pdVar3);
  pdVar3 = Vec3<double>::operator[](local_10,1);
  local_30 = Math<double>::sin(*pdVar3);
  pdVar3 = Vec3<double>::operator[](local_10,0);
  local_40 = Math<double>::sin(*pdVar3);
  local_48 = local_18 * local_28;
  local_50 = local_20 * local_28;
  local_58 = -local_30;
  local_60 = -local_20 * local_38 + local_18 * local_30 * local_40;
  local_68 = local_18 * local_38 + local_20 * local_30 * local_40;
  local_70 = local_28 * local_40;
  local_78 = -local_20 * -local_40 + local_18 * local_30 * local_38;
  local_80 = local_18 * -local_40 + local_20 * local_30 * local_38;
  local_88 = local_28 * local_38;
  Matrix44(&local_108,in_RDI);
  pdVar3 = operator[](&local_108,0);
  dVar2 = local_48;
  dVar1 = *pdVar3;
  pdVar3 = operator[](&local_108,1);
  dVar4 = *pdVar3 * local_50;
  pdVar3 = operator[](&local_108,2);
  in_RDI->x[0][0] = *pdVar3 * local_58 + dVar1 * dVar2 + dVar4;
  pdVar3 = operator[](&local_108,0);
  dVar2 = local_48;
  dVar1 = pdVar3[1];
  pdVar3 = operator[](&local_108,1);
  dVar4 = pdVar3[1] * local_50;
  pdVar3 = operator[](&local_108,2);
  in_RDI->x[0][1] = pdVar3[1] * local_58 + dVar1 * dVar2 + dVar4;
  pdVar3 = operator[](&local_108,0);
  dVar2 = local_48;
  dVar1 = pdVar3[2];
  pdVar3 = operator[](&local_108,1);
  dVar4 = pdVar3[2] * local_50;
  pdVar3 = operator[](&local_108,2);
  in_RDI->x[0][2] = pdVar3[2] * local_58 + dVar1 * dVar2 + dVar4;
  pdVar3 = operator[](&local_108,0);
  dVar2 = local_48;
  dVar1 = pdVar3[3];
  pdVar3 = operator[](&local_108,1);
  dVar4 = pdVar3[3] * local_50;
  pdVar3 = operator[](&local_108,2);
  in_RDI->x[0][3] = pdVar3[3] * local_58 + dVar1 * dVar2 + dVar4;
  pdVar3 = operator[](&local_108,0);
  dVar2 = local_60;
  dVar1 = *pdVar3;
  pdVar3 = operator[](&local_108,1);
  dVar4 = *pdVar3 * local_68;
  pdVar3 = operator[](&local_108,2);
  in_RDI->x[1][0] = *pdVar3 * local_70 + dVar1 * dVar2 + dVar4;
  pdVar3 = operator[](&local_108,0);
  dVar2 = local_60;
  dVar1 = pdVar3[1];
  pdVar3 = operator[](&local_108,1);
  dVar4 = pdVar3[1] * local_68;
  pdVar3 = operator[](&local_108,2);
  in_RDI->x[1][1] = pdVar3[1] * local_70 + dVar1 * dVar2 + dVar4;
  pdVar3 = operator[](&local_108,0);
  dVar2 = local_60;
  dVar1 = pdVar3[2];
  pdVar3 = operator[](&local_108,1);
  dVar4 = pdVar3[2] * local_68;
  pdVar3 = operator[](&local_108,2);
  in_RDI->x[1][2] = pdVar3[2] * local_70 + dVar1 * dVar2 + dVar4;
  pdVar3 = operator[](&local_108,0);
  dVar2 = local_60;
  dVar1 = pdVar3[3];
  pdVar3 = operator[](&local_108,1);
  dVar4 = pdVar3[3] * local_68;
  pdVar3 = operator[](&local_108,2);
  in_RDI->x[1][3] = pdVar3[3] * local_70 + dVar1 * dVar2 + dVar4;
  pdVar3 = operator[](&local_108,0);
  dVar2 = local_78;
  dVar1 = *pdVar3;
  pdVar3 = operator[](&local_108,1);
  dVar4 = *pdVar3 * local_80;
  pdVar3 = operator[](&local_108,2);
  in_RDI->x[2][0] = *pdVar3 * local_88 + dVar1 * dVar2 + dVar4;
  pdVar3 = operator[](&local_108,0);
  dVar2 = local_78;
  dVar1 = pdVar3[1];
  pdVar3 = operator[](&local_108,1);
  dVar4 = pdVar3[1] * local_80;
  pdVar3 = operator[](&local_108,2);
  in_RDI->x[2][1] = pdVar3[1] * local_88 + dVar1 * dVar2 + dVar4;
  pdVar3 = operator[](&local_108,0);
  dVar2 = local_78;
  dVar1 = pdVar3[2];
  pdVar3 = operator[](&local_108,1);
  dVar4 = pdVar3[2] * local_80;
  pdVar3 = operator[](&local_108,2);
  in_RDI->x[2][2] = pdVar3[2] * local_88 + dVar1 * dVar2 + dVar4;
  pdVar3 = operator[](&local_108,0);
  dVar2 = local_78;
  dVar1 = pdVar3[3];
  pdVar3 = operator[](&local_108,1);
  dVar4 = pdVar3[3] * local_80;
  pdVar3 = operator[](&local_108,2);
  in_RDI->x[2][3] = pdVar3[3] * local_88 + dVar1 * dVar2 + dVar4;
  return in_RDI;
}

Assistant:

const Matrix44<T> &
Matrix44<T>::rotate (const Vec3<S> &r)
{
    S cos_rz, sin_rz, cos_ry, sin_ry, cos_rx, sin_rx;
    S m00, m01, m02;
    S m10, m11, m12;
    S m20, m21, m22;

    cos_rz = Math<S>::cos (r[2]);
    cos_ry = Math<S>::cos (r[1]);
    cos_rx = Math<S>::cos (r[0]);
    
    sin_rz = Math<S>::sin (r[2]);
    sin_ry = Math<S>::sin (r[1]);
    sin_rx = Math<S>::sin (r[0]);

    m00 =  cos_rz *  cos_ry;
    m01 =  sin_rz *  cos_ry;
    m02 = -sin_ry;
    m10 = -sin_rz *  cos_rx + cos_rz * sin_ry * sin_rx;
    m11 =  cos_rz *  cos_rx + sin_rz * sin_ry * sin_rx;
    m12 =  cos_ry *  sin_rx;
    m20 = -sin_rz * -sin_rx + cos_rz * sin_ry * cos_rx;
    m21 =  cos_rz * -sin_rx + sin_rz * sin_ry * cos_rx;
    m22 =  cos_ry *  cos_rx;

    Matrix44<T> P (*this);

    x[0][0] = P[0][0] * m00 + P[1][0] * m01 + P[2][0] * m02;
    x[0][1] = P[0][1] * m00 + P[1][1] * m01 + P[2][1] * m02;
    x[0][2] = P[0][2] * m00 + P[1][2] * m01 + P[2][2] * m02;
    x[0][3] = P[0][3] * m00 + P[1][3] * m01 + P[2][3] * m02;

    x[1][0] = P[0][0] * m10 + P[1][0] * m11 + P[2][0] * m12;
    x[1][1] = P[0][1] * m10 + P[1][1] * m11 + P[2][1] * m12;
    x[1][2] = P[0][2] * m10 + P[1][2] * m11 + P[2][2] * m12;
    x[1][3] = P[0][3] * m10 + P[1][3] * m11 + P[2][3] * m12;

    x[2][0] = P[0][0] * m20 + P[1][0] * m21 + P[2][0] * m22;
    x[2][1] = P[0][1] * m20 + P[1][1] * m21 + P[2][1] * m22;
    x[2][2] = P[0][2] * m20 + P[1][2] * m21 + P[2][2] * m22;
    x[2][3] = P[0][3] * m20 + P[1][3] * m21 + P[2][3] * m22;

    return *this;
}